

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

int QUtf8::compareUtf8(QByteArrayView utf8,QLatin1StringView s,CaseSensitivity cs)

{
  byte bVar1;
  char32_t ucs4;
  char32_t cVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  pbVar4 = (byte *)s.m_data;
  pbVar6 = (byte *)(utf8.m_data + utf8.m_size);
  pbVar3 = pbVar4 + s.m_size;
  pbVar5 = (byte *)utf8.m_data;
  do {
    if ((pbVar6 <= pbVar5) || (pbVar3 <= pbVar4)) {
      return (uint)(pbVar5 < pbVar6) - (uint)(pbVar4 < pbVar3);
    }
    ucs4 = (char32_t)*pbVar5;
    if ((char)*pbVar5 < '\0') {
      ucs4 = L'�';
    }
    bVar1 = *pbVar4;
    cVar2 = (char32_t)bVar1;
    if (cs == CaseInsensitive) {
      ucs4 = QChar::toCaseFolded(ucs4);
      cVar2 = QChar::toCaseFolded((uint)bVar1);
    }
    pbVar4 = pbVar4 + 1;
    pbVar5 = pbVar5 + 1;
  } while (ucs4 - cVar2 == 0);
  return ucs4 - cVar2;
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView utf8, QLatin1StringView s, Qt::CaseSensitivity cs)
{
    char32_t uc1 = QChar::Null;
    auto src1 = reinterpret_cast<const uchar *>(utf8.data());
    auto end1 = src1 + utf8.size();
    auto src2 = reinterpret_cast<const uchar *>(s.latin1());
    auto end2 = src2 + s.size();

    while (src1 < end1 && src2 < end2) {
        uchar b = *src1++;
        char32_t *output = &uc1;
        const qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        }

        char32_t uc2 = *src2++;
        if (cs == Qt::CaseInsensitive) {
            uc1 = QChar::toCaseFolded(uc1);
            uc2 = QChar::toCaseFolded(uc2);
        }
        if (uc1 != uc2)
            return int(uc1) - int(uc2);
    }

    // the shorter string sorts first
    return (end1 > src1) - (end2 > src2);
}